

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O0

CheckStreamRez * __thiscall
H264StreamReader::checkStream
          (CheckStreamRez *__return_storage_ptr__,H264StreamReader *this,uint8_t *buffer,int len)

{
  bool bVar1;
  int iVar2;
  SPSUnit *pSVar3;
  ulong uVar4;
  PPSUnit *pPVar5;
  pointer ppVar6;
  pair<unsigned_int,_SPSUnit_*> pVar7;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_int,_SPSUnit_*>_>::value,_pair<iterator,_bool>_>
  _Var8;
  pair<unsigned_int,_PPSUnit_*> pVar9;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_int,_PPSUnit_*>_>::value,_pair<iterator,_bool>_>
  _Var10;
  int local_6d0;
  byte local_6aa;
  bool local_671;
  BitStreamException *e;
  int nalRez;
  int decodedLen;
  int toDecode;
  uint8_t tmpBuffer [512];
  string local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  string local_370;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_SPSUnit_*>_> local_350;
  SPSUnit *local_348;
  SPSUnit *sps_1;
  undefined1 local_338;
  pair<unsigned_int,_PPSUnit_*> local_330;
  _Self local_320;
  _Self local_318;
  _Self local_310;
  _Self local_308;
  PPSUnit *local_300;
  PPSUnit *pps;
  _Base_ptr local_2d8;
  undefined1 local_2d0;
  pair<unsigned_int,_SPSUnit_*> local_2c8;
  _Self local_2b8;
  _Self local_2b0;
  SPSUnit *local_2a8;
  SPSUnit *sps;
  uint8_t *nextNal;
  NALType nalType;
  uint8_t *nal;
  string local_280 [6];
  bool offsetsInserted;
  bool pulldownInserted;
  string tmpDescr;
  uint8_t *end;
  undefined1 local_248 [8];
  SliceUnit slice;
  SEIUnit lastSEI;
  int len_local;
  uint8_t *buffer_local;
  H264StreamReader *this_local;
  CheckStreamRez *rez;
  
  lastSEI.m_mvcHeaderStart._4_4_ = len;
  SEIUnit::SEIUnit((SEIUnit *)&slice.sps);
  SliceUnit::SliceUnit((SliceUnit *)local_248);
  CheckStreamRez::CheckStreamRez(__return_storage_ptr__);
  tmpDescr.field_2._8_8_ = buffer + lastSEI.m_mvcHeaderStart._4_4_;
  std::__cxx11::string::string(local_280);
  nal._7_1_ = 0;
  nal._6_1_ = 0;
  for (_nalType = NALUnit::findNextNAL(buffer,(uint8_t *)tmpDescr.field_2._8_8_);
      _nalType < (byte *)(tmpDescr.field_2._8_8_ + -4);
      _nalType = NALUnit::findNextNAL(_nalType,(uint8_t *)tmpDescr.field_2._8_8_)) {
    if ((*_nalType & 0x80) != 0) goto LAB_002997ac;
    nextNal._0_4_ = *_nalType & 0x1f;
    sps = (SPSUnit *)NALUnit::findNALWithStartCode(_nalType,(uint8_t *)tmpDescr.field_2._8_8_,true);
    if ((((this->super_MPEGStreamReader).m_eof & 1U) == 0) &&
       (sps == (SPSUnit *)tmpDescr.field_2._8_8_)) break;
    switch((uint)nextNal) {
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 0x14:
      bVar1 = std::
              map<unsigned_int,_PPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_PPSUnit_*>_>_>
              ::empty(&this->m_ppsMap);
      if ((!bVar1) &&
         (bVar1 = std::
                  map<unsigned_int,_SPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SPSUnit_*>_>_>
                  ::empty(&this->m_spsMap), !bVar1)) {
        if ((ulong)((long)sps - (long)_nalType) < 0x1f8) {
          local_6d0 = (int)sps - (int)_nalType;
        }
        else {
          local_6d0 = 0x1f8;
        }
        iVar2 = NALUnit::decodeNAL(_nalType,_nalType + local_6d0,(uint8_t *)&decodedLen,0x200);
        iVar2 = SliceUnit::deserialize
                          ((SliceUnit *)local_248,(uint8_t *)&decodedLen,
                           (uint8_t *)((long)&decodedLen + (long)iVar2),&this->m_spsMap,
                           &this->m_ppsMap);
        if (iVar2 != 0) goto LAB_002997ac;
        if ((this->m_mvcSubStream & 1U) == 0) {
          CodecInfo::operator=(&__return_storage_ptr__->codecInfo,&::h264CodecInfo);
        }
        else {
          CodecInfo::operator=(&__return_storage_ptr__->codecInfo,&::h264DepCodecInfo);
        }
        std::__cxx11::string::operator=((string *)&__return_storage_ptr__->streamDescr,local_280);
      }
      break;
    case 6:
      bVar1 = std::
              map<unsigned_int,_SPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SPSUnit_*>_>_>
              ::empty(&this->m_spsMap);
      if (!bVar1) {
        local_350._M_node =
             (_Base_ptr)
             std::
             map<unsigned_int,_SPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SPSUnit_*>_>_>
             ::begin(&this->m_spsMap);
        ppVar6 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_SPSUnit_*>_>::operator->
                           (&local_350);
        local_348 = ppVar6->second;
        NALUnit::decodeBuffer((NALUnit *)&slice.sps,_nalType,(uint8_t *)sps);
        local_6aa = 1;
        if (((local_348->nalHrdParams).isPresent & 1U) == 0) {
          local_6aa = (local_348->vclHrdParams).isPresent;
        }
        SEIUnit::deserialize((SEIUnit *)&slice.sps,local_348,local_6aa & 1);
        if ((((((char)lastSEI.super_NALUnit.bitReader.m_curVal == '\x05') ||
              ((char)lastSEI.super_NALUnit.bitReader.m_curVal == '\x06')) ||
             ((char)lastSEI.super_NALUnit.bitReader.m_curVal == '\a')) ||
            ((char)lastSEI.super_NALUnit.bitReader.m_curVal == '\b')) && ((nal._7_1_ & 1) == 0)) {
          nal._7_1_ = 1;
          SPSUnit::getStreamDescr_abi_cxx11_(&local_370,local_348);
          std::__cxx11::string::operator=(local_280,(string *)&local_370);
          std::__cxx11::string::~string((string *)&local_370);
          std::__cxx11::string::operator+=(local_280," (pulldown)");
        }
        if (((nal._6_1_ & 1) == 0) && (-1 < lastSEI.initial_cpb_removal_delay_offset[0x1e])) {
          nal._6_1_ = 1;
          int32ToStr_abi_cxx11_(&local_3b0,lastSEI.initial_cpb_removal_delay_offset + 0x1e);
          std::operator+(&local_390,"  3d-pg-planes: ",&local_3b0);
          std::__cxx11::string::operator+=(local_280,(string *)&local_390);
          std::__cxx11::string::~string((string *)&local_390);
          std::__cxx11::string::~string((string *)&local_3b0);
        }
      }
      break;
    case 7:
      goto switchD_00298e38_caseD_7;
    case 8:
      pPVar5 = (PPSUnit *)operator_new(0x58);
      PPSUnit::PPSUnit(pPVar5);
      local_300 = pPVar5;
      NALUnit::decodeBuffer((NALUnit *)pPVar5,_nalType,(uint8_t *)sps);
      iVar2 = PPSUnit::deserialize(local_300);
      pPVar5 = local_300;
      if (iVar2 != 0) {
        if (local_300 != (PPSUnit *)0x0) {
          PPSUnit::~PPSUnit(local_300);
          operator_delete(pPVar5,0x58);
        }
        goto LAB_002997ac;
      }
      local_308._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_SPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SPSUnit_*>_>_>
           ::find(&this->m_spsMap,&local_300->seq_parameter_set_id);
      local_310._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_SPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SPSUnit_*>_>_>
           ::end(&this->m_spsMap);
      bVar1 = std::operator==(&local_308,&local_310);
      local_671 = true;
      if (!bVar1) {
        local_318._M_node =
             (_Base_ptr)
             std::
             map<unsigned_int,_PPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_PPSUnit_*>_>_>
             ::find(&this->m_ppsMap,&local_300->pic_parameter_set_id);
        local_320._M_node =
             (_Base_ptr)
             std::
             map<unsigned_int,_PPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_PPSUnit_*>_>_>
             ::end(&this->m_ppsMap);
        local_671 = std::operator!=(&local_318,&local_320);
      }
      pPVar5 = local_300;
      if (local_671 == false) {
        pVar9 = std::make_pair<unsigned_int&,PPSUnit*&>(&local_300->pic_parameter_set_id,&local_300)
        ;
        local_330.second = pVar9.second;
        local_330.first = pVar9.first;
        _Var10 = std::
                 map<unsigned_int,PPSUnit*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,PPSUnit*>>>
                 ::insert<std::pair<unsigned_int,PPSUnit*>>
                           ((map<unsigned_int,PPSUnit*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,PPSUnit*>>>
                             *)&this->m_ppsMap,&local_330);
        sps_1 = (SPSUnit *)_Var10.first._M_node;
        local_338 = _Var10.second;
      }
      else if (local_300 != (PPSUnit *)0x0) {
        PPSUnit::~PPSUnit(local_300);
        operator_delete(pPVar5,0x58);
      }
      break;
    default:
      break;
    case 0xf:
      this->m_mvcSubStream = true;
switchD_00298e38_caseD_7:
      if ((uint)nextNal == 7) {
        this->m_mvcPrimaryStream = true;
      }
      pSVar3 = (SPSUnit *)operator_new(0x200);
      SPSUnit::SPSUnit(pSVar3);
      local_2a8 = pSVar3;
      NALUnit::decodeBuffer((NALUnit *)pSVar3,_nalType,(uint8_t *)sps);
      iVar2 = SPSUnit::deserialize(local_2a8);
      pSVar3 = local_2a8;
      if (iVar2 != 0) {
        if (local_2a8 != (SPSUnit *)0x0) {
          SPSUnit::~SPSUnit(local_2a8);
          operator_delete(pSVar3,0x200);
        }
        goto LAB_002997ac;
      }
      local_2b0._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_SPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SPSUnit_*>_>_>
           ::find(&this->m_spsMap,&local_2a8->seq_parameter_set_id);
      local_2b8._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_SPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SPSUnit_*>_>_>
           ::end(&this->m_spsMap);
      bVar1 = std::operator!=(&local_2b0,&local_2b8);
      pSVar3 = local_2a8;
      if (bVar1) {
        if (local_2a8 != (SPSUnit *)0x0) {
          SPSUnit::~SPSUnit(local_2a8);
          operator_delete(pSVar3,0x200);
        }
      }
      else {
        pVar7 = std::make_pair<unsigned_int&,SPSUnit*&>(&local_2a8->seq_parameter_set_id,&local_2a8)
        ;
        local_2c8.second = pVar7.second;
        local_2c8.first = pVar7.first;
        _Var8 = std::
                map<unsigned_int,SPSUnit*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,SPSUnit*>>>
                ::insert<std::pair<unsigned_int,SPSUnit*>>
                          ((map<unsigned_int,SPSUnit*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,SPSUnit*>>>
                            *)&this->m_spsMap,&local_2c8);
        local_2d8 = (_Base_ptr)_Var8.first._M_node;
        local_2d0 = _Var8.second;
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) != 0) {
          SPSUnit::getStreamDescr_abi_cxx11_((string *)&pps,local_2a8);
          std::__cxx11::string::operator=(local_280,(string *)&pps);
          std::__cxx11::string::~string((string *)&pps);
        }
      }
    }
  }
  if (((this->m_mvcSubStream & 1U) != 0) && ((this->m_mvcPrimaryStream & 1U) != 0)) {
    __return_storage_ptr__->multiSubStream = true;
  }
LAB_002997ac:
  nextNal._4_4_ = 1;
  std::__cxx11::string::~string(local_280);
  SliceUnit::~SliceUnit((SliceUnit *)local_248);
  SEIUnit::~SEIUnit((SEIUnit *)&slice.sps);
  return __return_storage_ptr__;
}

Assistant:

CheckStreamRez H264StreamReader::checkStream(uint8_t *buffer, int len)
{
    SEIUnit lastSEI;
    SliceUnit slice;
    CheckStreamRez rez;
    uint8_t *end = buffer + len;
    std::string tmpDescr;
    bool pulldownInserted = false;
    bool offsetsInserted = false;

    for (uint8_t *nal = NALUnit::findNextNAL(buffer, end); nal < end - 4; nal = NALUnit::findNextNAL(nal, end))
    {
        if (*nal & 0x80)
            return rez;
        auto nalType = static_cast<NALUnit::NALType>(*nal & 0x1f);
        const uint8_t *nextNal = NALUnit::findNALWithStartCode(nal, end, true);
        if (!m_eof && nextNal == end)
            break;

        switch (nalType)
        {
        case NALUnit::NALType::nuSubSPS:
            m_mvcSubStream = true;
            [[fallthrough]];
        case NALUnit::NALType::nuSPS:
        {
            if (nalType == NALUnit::NALType::nuSPS)
                m_mvcPrimaryStream = true;
            auto sps = new SPSUnit();
            sps->decodeBuffer(nal, nextNal);
            if (sps->deserialize() != 0)
            {
                delete sps;
                return rez;
            }
            if (m_spsMap.find(sps->seq_parameter_set_id) != m_spsMap.end())
            {
                delete sps;
                break;
            }
            m_spsMap.insert(make_pair(sps->seq_parameter_set_id, sps));
            if (tmpDescr.empty())
                tmpDescr = sps->getStreamDescr();
            break;
        }
        case NALUnit::NALType::nuPPS:
        {
            auto pps = new PPSUnit();
            pps->decodeBuffer(nal, nextNal);
            if (pps->deserialize() != 0)
            {
                delete pps;
                return rez;
            }
            if (m_spsMap.find(pps->seq_parameter_set_id) == m_spsMap.end() ||
                m_ppsMap.find(pps->pic_parameter_set_id) != m_ppsMap.end())
            {
                delete pps;
                break;
            }
            m_ppsMap.insert(make_pair(pps->pic_parameter_set_id, pps));
            break;
        }
        case NALUnit::NALType::nuSEI:
            if (!m_spsMap.empty())
            {
                SPSUnit *sps = m_spsMap.begin()->second;
                lastSEI.decodeBuffer(nal, nextNal);
                lastSEI.deserialize(*sps, sps->nalHrdParams.isPresent || sps->vclHrdParams.isPresent);
                if (lastSEI.pic_struct == 5 || lastSEI.pic_struct == 6 || lastSEI.pic_struct == 7 ||
                    lastSEI.pic_struct == 8)
                {
                    if (!pulldownInserted)
                    {
                        pulldownInserted = true;
                        tmpDescr = sps->getStreamDescr();
                        tmpDescr += " (pulldown)";
                    }
                }
                if (!offsetsInserted && lastSEI.number_of_offset_sequences >= 0)
                {
                    offsetsInserted = true;
                    tmpDescr += "  3d-pg-planes: " + int32ToStr(lastSEI.number_of_offset_sequences);
                }
            }
            break;

        case NALUnit::NALType::nuSliceIDR:
            // m_openGOP = false;
        case NALUnit::NALType::nuSliceNonIDR:
        case NALUnit::NALType::nuSliceA:
        case NALUnit::NALType::nuSliceB:
        case NALUnit::NALType::nuSliceC:
        case NALUnit::NALType::nuSliceExt:
            if (m_ppsMap.empty() || m_spsMap.empty())
                break;
            try
            {
                uint8_t tmpBuffer[512];
                int toDecode = static_cast<int>(FFMIN(sizeof(tmpBuffer) - 8, nextNal - nal));
                int decodedLen = SliceUnit::decodeNAL(nal, nal + toDecode, tmpBuffer, sizeof(tmpBuffer));
                int nalRez = slice.deserialize(tmpBuffer, tmpBuffer + decodedLen, m_spsMap, m_ppsMap);
                if (nalRez != 0)
                    return rez;

                if (m_mvcSubStream)
                    rez.codecInfo = h264DepCodecInfo;
                else
                    rez.codecInfo = h264CodecInfo;
                rez.streamDescr = tmpDescr;
            }
            catch (BitStreamException &e)
            {
                (void)e;
                return rez;
            }
            break;
        default:
            break;
        }
    }
    if (m_mvcSubStream && m_mvcPrimaryStream)
        rez.multiSubStream = true;

    return rez;
}